

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

int __thiscall ON_BinaryArchive::Read3dmLayer(ON_BinaryArchive *this,ON_Layer **ppLayer)

{
  ON_Object *pOVar1;
  bool bVar2;
  int iVar3;
  ON_Layer *this_00;
  ON__UINT32 tcode;
  ON_Layer *layer;
  ON__INT64 big_value;
  uint local_3c;
  ON_Layer *local_38;
  ON_Object *local_30;
  ON__INT64 local_28;
  
  bVar2 = Read3dmTableRecord(this,layer_table,ppLayer);
  if (!bVar2) {
    return 0;
  }
  local_38 = (ON_Layer *)0x0;
  if (this->m_3dm_version == 1) {
    bVar2 = Read3dmV1Layer(this,&local_38);
    this_00 = local_38;
    if (local_38 == (ON_Layer *)0x0 || !bVar2) {
LAB_003a1991:
      if (this_00 == (ON_Layer *)0x0) goto LAB_003a19a7;
    }
    else {
      Internal_Read3dmUpdateManifest(this,&local_38->super_ON_ModelComponent);
    }
    ON_Layer::HasPerViewportSettings(this_00,&ON_nil_uuid);
  }
  else {
    local_3c = 0;
    local_28 = 0;
    bVar2 = BeginRead3dmBigChunk(this,&local_3c,&local_28);
    if (bVar2) {
      if (local_3c == 0xffffffff) {
        this_00 = (ON_Layer *)0x0;
      }
      else {
        if (local_3c == 0x20008050) {
          Internal_Increment3dmTableItemCount(this);
          local_30 = (ON_Object *)0x0;
          iVar3 = ReadObjectHelper(this,&local_30);
          pOVar1 = local_30;
          if (iVar3 != 0) {
            this_00 = ON_Layer::Cast(local_30);
            local_38 = this_00;
            if (this_00 != (ON_Layer *)0x0) {
              Internal_Read3dmUpdateManifest(this,&this_00->super_ON_ModelComponent);
              goto LAB_003a1987;
            }
            if (pOVar1 != (ON_Object *)0x0) {
              (*pOVar1->_vptr_ON_Object[4])(pOVar1);
            }
          }
          iVar3 = 0x2864;
        }
        else {
          iVar3 = 0x2868;
        }
        this_00 = (ON_Layer *)0x0;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,iVar3,"","ON_BinaryArchive::Read3dmLayer() - corrupt layer table");
      }
LAB_003a1987:
      EndRead3dmChunk(this,false);
      goto LAB_003a1991;
    }
LAB_003a19a7:
    this_00 = (ON_Layer *)0x0;
  }
  *ppLayer = this_00;
  return (uint)(this_00 != (ON_Layer *)0x0);
}

Assistant:

int ON_BinaryArchive::Read3dmLayer( ON_Layer** ppLayer )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::layer_table, (void**)ppLayer))
    return 0;

  ON__UINT32 tcode;
  ON__INT64 big_value;
  ON_Layer* layer = nullptr;
  // returns 0 at end of layer table
  if ( m_3dm_version == 1 )
  {
    if (Read3dmV1Layer(layer) && nullptr != layer)
      Internal_Read3dmUpdateManifest(*layer);
  }
  else 
  {
    // version 2+
    tcode = 0;
    big_value = 0;
    if ( BeginRead3dmBigChunk( &tcode, &big_value ) )
    {
      if ( tcode == TCODE_LAYER_RECORD )
      {
        Internal_Increment3dmTableItemCount();
        ON_Object* p = 0;
        if ( ReadObject( &p ) )
        {
          layer = ON_Layer::Cast(p);
          if ( nullptr == layer )
            delete p;
          else
          {
            Internal_Read3dmUpdateManifest(*layer);
          }
        }
        if (nullptr == layer) {
          ON_ERROR("ON_BinaryArchive::Read3dmLayer() - corrupt layer table");
        }
      }
      else if ( tcode != TCODE_ENDOFTABLE ) {
        ON_ERROR("ON_BinaryArchive::Read3dmLayer() - corrupt layer table");
      }
      EndRead3dmChunk();
    }
  }
  if ( layer )
    layer->HasPerViewportSettings(ON_nil_uuid); // this call sets ON_Layer::m__runtime_flags
  *ppLayer = layer;
  return (layer) ? 1 : 0;
}